

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int idaLsJacTimesSetupBS
              (sunrealtype tt,N_Vector yyB,N_Vector ypB,N_Vector rrB,sunrealtype c_jB,void *ida_mem)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  int retval;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem *in_stack_ffffffffffffff88;
  IDAadjMem *in_stack_ffffffffffffff90;
  IDAMem *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long lVar2;
  
  lVar2 = 0;
  idaLs_AccessLMemBCur
            ((void *)0x0,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (IDALsMemB *)0x13858d);
  if (iRam00000000000000c0 == 0) {
    if (iRam00000000000000bc == 0) {
      iVar1 = (*pcRam0000000000000098)(in_XMM0_Qa,0,uRam0000000000000158,uRam0000000000000160,0);
    }
    else {
      iVar1 = (*pcRam0000000000000098)
                        (in_XMM0_Qa,0,uRam0000000000000158,uRam0000000000000160,uRam0000000000000168
                         ,uRam0000000000000170);
    }
    if (iVar1 != 0) {
      IDAProcessError(*(IDAMem *)(lVar2 + 0x10),-1,0x9d4,"idaLsJacTimesSetupBS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                      ,"Bad t for interpolation.");
      return -1;
    }
  }
  iVar1 = (*pcRam0000000000000018)
                    (in_XMM0_Qa,in_XMM1_Qa,uRam0000000000000158,uRam0000000000000160,
                     uRam0000000000000168,uRam0000000000000170,in_RDI,in_RSI,in_RDX,
                     *(undefined8 *)(lVar2 + 0x40));
  return iVar1;
}

Assistant:

static int idaLsJacTimesSetupBS(sunrealtype tt, N_Vector yyB, N_Vector ypB,
                                N_Vector rrB, sunrealtype c_jB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDALsMemB idalsB_mem;
  IDABMem IDAB_mem;
  int retval;

  /* access relevant memory structures */
  IDA_mem    = NULL;
  IDAADJ_mem = NULL;
  idalsB_mem = NULL;
  IDAB_mem   = NULL;
  retval     = idaLs_AccessLMemBCur(ida_mem, __func__, &IDA_mem, &IDAADJ_mem,
                                    &IDAB_mem, &idalsB_mem);

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    if (IDAADJ_mem->ia_interpSensi)
    {
      retval = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                   IDAADJ_mem->ia_ypTmp, IDAADJ_mem->ia_yySTmp,
                                   IDAADJ_mem->ia_ypSTmp);
    }
    else
    {
      retval = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                   IDAADJ_mem->ia_ypTmp, NULL, NULL);
    }
    if (retval != IDA_SUCCESS)
    {
      IDAProcessError(IDAB_mem->IDA_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_T);
      return (-1);
    }
  }

  /* Call user's adjoint jtimesBS routine */
  return (idalsB_mem->jtsetupBS(tt, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                                IDAADJ_mem->ia_yySTmp, IDAADJ_mem->ia_ypSTmp,
                                yyB, ypB, rrB, c_jB, IDAB_mem->ida_user_data));
}